

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintNumberHex(UNITY_UINT number,char nibbles_to_print)

{
  uint uVar1;
  char nibbles;
  undefined3 in_register_00000031;
  int __c;
  long lVar2;
  ulong uVar3;
  
  uVar1 = 0x10;
  if (CONCAT31(in_register_00000031,nibbles_to_print) < 0x11) {
    uVar1 = CONCAT31(in_register_00000031,nibbles_to_print);
  }
  if ('\0' < (char)uVar1) {
    lVar2 = (ulong)(uVar1 & 0xff) * 4;
    uVar3 = (ulong)(uVar1 & 0xff) + 1;
    do {
      lVar2 = lVar2 + -4;
      uVar1 = (uint)(number >> ((byte)lVar2 & 0x3f)) & 0xf;
      __c = uVar1 + 0x30;
      if (9 < uVar1) {
        __c = uVar1 + 0x37;
      }
      putchar(__c);
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

void UnityPrintNumberHex(const UNITY_UINT number, const char nibbles_to_print)
{
    int nibble;
    char nibbles = nibbles_to_print;
    if ((unsigned)nibbles > (2 * sizeof(number)))
        nibbles = 2 * sizeof(number);

    while (nibbles > 0)
    {
        nibbles--;
        nibble = (int)(number >> (nibbles * 4)) & 0x0F;
        if (nibble <= 9)
        {
            UNITY_OUTPUT_CHAR((char)('0' + nibble));
        }
        else
        {
            UNITY_OUTPUT_CHAR((char)('A' - 10 + nibble));
        }
    }
}